

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical.cxx
# Opt level: O2

void __thiscall Unit::operator-=(Unit *this,Unit *u)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  
  if (this->bInvalid != false) {
    return;
  }
  bVar1 = false;
  for (lVar3 = 1; lVar3 != 8; lVar3 = lVar3 + 1) {
    if (this->siUnits[lVar3 + -1] != u->siUnits[lVar3 + -1]) {
      this->bInvalid = true;
      bVar1 = true;
    }
  }
  if (this->nExpPrefix == u->nExpPrefix) {
    if (!bVar1) {
      return;
    }
  }
  else {
    this->bInvalid = true;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"warning: trying to subtract ");
  poVar2 = std::operator<<(poVar2,(string *)&u->sUnitName);
  poVar2 = std::operator<<(poVar2," (");
  poVar2 = std::operator<<(poVar2,(string *)&u->sUnitSymbol);
  poVar2 = std::operator<<(poVar2,") from ");
  poVar2 = std::operator<<(poVar2,(string *)&this->sUnitName);
  poVar2 = std::operator<<(poVar2," (");
  poVar2 = std::operator<<(poVar2,(string *)&this->sUnitSymbol);
  poVar2 = std::operator<<(poVar2,")");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void Unit::operator-=(const Unit& u)
{
	if( !bInvalid ) {
		for(int i=0; i<7; i++)
			if(siUnits[i] != u.siUnits[i])
				bInvalid = true;
		if(nExpPrefix != u.nExpPrefix)
			bInvalid = true;
	} else
		return;
	if(bInvalid)
		cout << "warning: trying to subtract "
			<< u.sUnitName << " (" << u.sUnitSymbol << ") from "
			<< sUnitName << " (" << sUnitSymbol << ")" 
			<< endl;
}